

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::Node::set_motion_vector(Node *this,Vec3fa *dP)

{
  _func_int **in_RSI;
  Node *in_RDI;
  Vec3fa *in_stack_00000620;
  Ref<embree::SceneGraph::Node> *in_stack_00000628;
  _func_int **local_50 [4];
  _func_int ***local_30;
  _func_int ***local_18;
  
  local_18 = local_50;
  local_50[0] = in_RSI;
  if (in_RSI != (_func_int **)0x0) {
    (**(code **)(*in_RSI + 0x10))();
  }
  SceneGraph::set_motion_vector(in_stack_00000628,in_stack_00000620);
  local_30 = local_50;
  if (local_50[0] != (_func_int **)0x0) {
    (**(code **)(*local_50[0] + 0x18))();
  }
  (in_RDI->super_RefCount)._vptr_RefCount = in_RSI;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<Node> set_motion_vector(const Vec3fa& dP) {
        SceneGraph::set_motion_vector(this,dP); return this;
      }